

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::PipelineBarrier::submit(PipelineBarrier *this,SubmitContext *context)

{
  Type TVar1;
  Context *this_00;
  DeviceInterface *pDVar2;
  VkCommandBuffer pVVar3;
  VkImageLayout *pVVar4;
  undefined4 local_c0 [2];
  VkImageMemoryBarrier barrier_2;
  VkBufferMemoryBarrier barrier_1;
  VkMemoryBarrier barrier;
  VkCommandBuffer cmd;
  DeviceInterface *vkd;
  SubmitContext *context_local;
  PipelineBarrier *this_local;
  
  this_00 = SubmitContext::getContext(context);
  pDVar2 = Context::getDeviceInterface(this_00);
  pVVar3 = SubmitContext::getCommandBuffer(context);
  TVar1 = this->m_type;
  if (TVar1 == TYPE_GLOBAL) {
    barrier_1.size._0_4_ = 0x2e;
    (*pDVar2->_vptr_DeviceInterface[0x6d])
              (pDVar2,pVVar3,(ulong)this->m_srcStages,(ulong)this->m_dstStages,0,1,&barrier_1.size,0
               ,0,0,0);
  }
  else if (TVar1 == TYPE_BUFFER) {
    barrier_2.subresourceRange.layerCount = 0x2c;
    barrier_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    barrier_1._4_4_ = 0;
    barrier_1.pNext._0_4_ = this->m_srcAccesses;
    barrier_1.pNext._4_4_ = this->m_dstAccesses;
    barrier_1.srcAccessMask = 0xffffffff;
    barrier_1.dstAccessMask = 0xffffffff;
    barrier_1._24_8_ = SubmitContext::getBuffer(context);
    barrier_1.buffer.m_internal = 0;
    barrier_1.offset = 0xffffffffffffffff;
    (*pDVar2->_vptr_DeviceInterface[0x6d])
              (pDVar2,pVVar3,(ulong)this->m_srcStages,(ulong)this->m_dstStages,0,0,0,1,
               &barrier_2.subresourceRange.layerCount,0,0);
  }
  else if (TVar1 == TYPE_IMAGE) {
    local_c0[0] = 0x2d;
    barrier_2.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    barrier_2._4_4_ = 0;
    barrier_2.pNext._0_4_ = this->m_srcAccesses;
    barrier_2.pNext._4_4_ = this->m_dstAccesses;
    pVVar4 = tcu::Maybe<vk::VkImageLayout>::operator*(&this->m_imageLayout);
    barrier_2.srcAccessMask = *pVVar4;
    pVVar4 = tcu::Maybe<vk::VkImageLayout>::operator*(&this->m_imageLayout);
    barrier_2.dstAccessMask = *pVVar4;
    barrier_2.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    barrier_2.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    barrier_2._32_8_ = SubmitContext::getImage(context);
    barrier_2.image.m_internal._0_4_ = 1;
    barrier_2.image.m_internal._4_4_ = 0;
    barrier_2.subresourceRange.aspectMask = 1;
    barrier_2.subresourceRange.baseMipLevel = 0;
    barrier_2.subresourceRange.levelCount = 1;
    (*pDVar2->_vptr_DeviceInterface[0x6d])
              (pDVar2,pVVar3,(ulong)this->m_srcStages,(ulong)this->m_dstStages,0,0,0,0,0,1,local_c0)
    ;
  }
  return;
}

Assistant:

void PipelineBarrier::submit (SubmitContext& context)
{
	const vk::DeviceInterface&	vkd	= context.getContext().getDeviceInterface();
	const vk::VkCommandBuffer	cmd	= context.getCommandBuffer();

	switch (m_type)
	{
		case TYPE_GLOBAL:
		{
			const vk::VkMemoryBarrier	barrier		=
			{
				vk::VK_STRUCTURE_TYPE_MEMORY_BARRIER,
				DE_NULL,

				m_srcAccesses,
				m_dstAccesses
			};

			vkd.cmdPipelineBarrier(cmd, m_srcStages, m_dstStages, (vk::VkDependencyFlags)0, 1, &barrier, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
			break;
		}

		case TYPE_BUFFER:
		{
			const vk::VkBufferMemoryBarrier	barrier		=
			{
				vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
				DE_NULL,

				m_srcAccesses,
				m_dstAccesses,

				VK_QUEUE_FAMILY_IGNORED,
				VK_QUEUE_FAMILY_IGNORED,

				context.getBuffer(),
				0,
				VK_WHOLE_SIZE
			};

			vkd.cmdPipelineBarrier(cmd, m_srcStages, m_dstStages, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &barrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);
			break;
		}

		case TYPE_IMAGE:
		{
			const vk::VkImageMemoryBarrier	barrier		=
			{
				vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
				DE_NULL,

				m_srcAccesses,
				m_dstAccesses,

				*m_imageLayout,
				*m_imageLayout,

				VK_QUEUE_FAMILY_IGNORED,
				VK_QUEUE_FAMILY_IGNORED,

				context.getImage(),
				{
					vk::VK_IMAGE_ASPECT_COLOR_BIT,
					0, 1,
					0, 1
				}
			};

			vkd.cmdPipelineBarrier(cmd, m_srcStages, m_dstStages, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 0, (const vk::VkBufferMemoryBarrier*)DE_NULL, 1, &barrier);
			break;
		}

		default:
			DE_FATAL("Unknown pipeline barrier type");
	}
}